

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

ExceptionOr<siginfo_t> * __thiscall
kj::_::ExceptionOr<siginfo_t>::operator=
          (ExceptionOr<siginfo_t> *this,ExceptionOr<siginfo_t> *param_1)

{
  ExceptionOr<siginfo_t> *param_1_local;
  ExceptionOr<siginfo_t> *this_local;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  Maybe<siginfo_t>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;